

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBTypes.cpp
# Opt level: O0

bool __thiscall
USBSignalFilter::GetPacket(USBSignalFilter *this,USBPacket *pckt,USBSignalState *sgnl)

{
  double dVar1;
  value_type vVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  size_type sVar7;
  reference pvVar8;
  difference_type dVar9;
  byte *pbVar10;
  reference pvVar11;
  reference puVar12;
  ulong uVar13;
  long lVar14;
  bool local_17a;
  bool local_176;
  uint local_164;
  byte local_13a;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_130;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_128;
  ushort local_11a;
  iterator iStack_118;
  U16 last_word;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_110;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_108;
  iterator i;
  undefined1 auStack_f8 [3];
  U8 val;
  U64 local_f0;
  USBState local_e8;
  undefined4 uStack_e4;
  double local_e0;
  uchar *local_d8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_d0;
  uchar auStack_c8 [8];
  U8 preArr [16];
  value_type_conflict local_b0;
  int local_a4;
  iterator iStack_a0;
  int bc;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_98;
  const_iterator local_90;
  uchar *local_88;
  U8 *add_end;
  U8 *add_begin;
  int num_bits;
  byte local_62;
  byte local_61;
  undefined1 local_60 [6];
  bool is_pre_packet;
  bool is_stuff_bit;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bits;
  double BIT_SAMPLES;
  double SAMPLE_DUR;
  double BIT_DUR;
  USBSignalState *pUStack_28;
  U8 bits2add [7];
  USBSignalState *sgnl_local;
  USBPacket *pckt_local;
  USBSignalFilter *this_local;
  
  pUStack_28 = sgnl;
  USBPacket::Clear(pckt);
  BIT_DUR._1_4_ = 0x1010100;
  BIT_DUR._5_2_ = 0x101;
  BIT_DUR._7_1_ = 1;
  if ((this->mExpectLowSpeed & 1U) != 0) {
    bVar4 = USBSignalState::IsData(pUStack_28,FULL_SPEED);
    if ((bVar4) && (iVar5 = USBSignalState::GetNumBits(pUStack_28,FULL_SPEED), iVar5 == 1)) {
      this->mSpeed = FULL_SPEED;
      this->mExpectLowSpeed = false;
    }
    else {
      this->mSpeed = LOW_SPEED;
    }
  }
  dVar1 = *(double *)(&DAT_00181d90 + (ulong)(this->mSpeed == FULL_SPEED) * 8);
  uVar6 = Analyzer::GetSampleRate();
  bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(dVar1 / (1000000000.0 / (double)uVar6));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  pckt->mSampleBegin = pUStack_28->mSampleBegin;
  local_61 = 0;
  local_62 = 0;
  while( true ) {
    bVar4 = USBSignalState::IsData(pUStack_28,this->mSpeed);
    local_13a = 0;
    if (bVar4) {
      local_13a = local_62 ^ 0xff;
    }
    if ((local_13a & 1) == 0) break;
    add_begin._0_4_ = USBSignalState::GetNumBits(pUStack_28,this->mSpeed);
    add_end = (U8 *)((long)&BIT_DUR + 1);
    local_88 = (uchar *)((long)&BIT_DUR + (long)(int)add_begin + 1);
    if ((local_61 & 1) != 0) {
      add_end = (U8 *)((long)&BIT_DUR + 2);
    }
    if ((((local_61 & 1) != 0) && (1 < (int)add_begin)) || (0 < (int)add_begin)) {
      local_98._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_90,&local_98);
      iStack_a0 = std::vector<unsigned_char,std::allocator<unsigned_char>>::
                  insert<unsigned_char_const*,void>
                            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_60,
                             local_90,add_end,local_88);
    }
    for (local_a4 = 0; local_a4 < (int)add_begin; local_a4 = local_a4 + 1) {
      if (((local_61 & 1) == 0) || (0 < local_a4)) {
        dVar3 = (double)bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage * (double)local_a4 + 0.5;
        uVar13 = (ulong)dVar3;
        local_b0 = pUStack_28->mSampleBegin +
                   (uVar13 | (long)(dVar3 - 9.223372036854776e+18) & (long)uVar13 >> 0x3f);
        std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                  (&pckt->mBitBeginSamples,&local_b0);
      }
      dVar3 = (double)bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage * ((double)local_a4 + 0.5) + 0.5;
      lVar14 = (long)dVar3;
      if (local_a4 == 0) {
        local_164 = 0xb;
        if ((local_61 & 1) != 0) {
          local_164 = 7;
        }
      }
      else {
        local_164 = 10;
      }
      AnalyzerResults::AddMarker
                ((ulonglong)this->mResults,
                 (int)pUStack_28->mSampleBegin +
                 ((uint)lVar14 |
                 (uint)(long)(dVar3 - 9.223372036854776e+18) & (uint)(lVar14 >> 0x3f)),
                 (Channel *)(ulong)local_164);
    }
    if ((this->mSpeed == FULL_SPEED) &&
       (sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60),
       sVar7 == 0x10)) {
      auStack_c8[0] = '\0';
      auStack_c8[1] = '\0';
      auStack_c8[2] = '\0';
      auStack_c8[3] = '\0';
      auStack_c8[4] = '\0';
      auStack_c8[5] = '\0';
      auStack_c8[6] = '\0';
      auStack_c8[7] = '\x01';
      preArr[0] = '\0';
      preArr[1] = '\0';
      preArr[2] = '\x01';
      preArr[3] = '\x01';
      preArr[4] = '\x01';
      preArr[5] = '\x01';
      preArr[6] = '\0';
      preArr[7] = '\0';
      local_d0._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
      local_d8 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     local_60);
      bVar4 = std::
              equal<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char_const*>
                        (local_d0,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                   )local_d8,auStack_c8);
      if (bVar4) {
        this->mSpeed = LOW_SPEED;
        this->mExpectLowSpeed = true;
        local_62 = 1;
      }
    }
    local_61 = (int)add_begin == 7;
    GetState((USBSignalState *)auStack_f8,this);
    pUStack_28->mSampleBegin = _auStack_f8;
    pUStack_28->mSampleEnd = local_f0;
    pUStack_28->mState = local_e8;
    *(undefined4 *)&pUStack_28->field_0x14 = uStack_e4;
    pUStack_28->mDur = local_e0;
  }
  pckt->mSampleEnd = pUStack_28->mSampleEnd;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
            (&pckt->mBitBeginSamples,&pUStack_28->mSampleBegin);
  bVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  if (((bVar4) ||
      (sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60),
      (sVar7 & 7) != 0)) ||
     (sVar7 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size
                        (&pckt->mBitBeginSamples), (sVar7 & 7) != 1)) {
    this_local._7_1_ = false;
    goto LAB_00163fe2;
  }
  pvVar8 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::front
                     (&pckt->mBitBeginSamples);
  pckt->mSampleBegin = *pvVar8;
  pckt->mSampleEnd = pUStack_28->mSampleEnd + (long)(dVar1 / (1000000000.0 / (double)uVar6) + 0.5);
  i._M_current._3_1_ = 0;
  local_108._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  while( true ) {
    local_110._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
    bVar4 = __gnu_cxx::operator!=(&local_108,&local_110);
    if (!bVar4) break;
    i._M_current._3_1_ = (byte)((int)(uint)i._M_current._3_1_ >> 1);
    puVar12 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator*(&local_108);
    if (*puVar12 != '\0') {
      i._M_current._3_1_ = i._M_current._3_1_ | 0x80;
    }
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&local_108);
    iStack_118 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
    dVar9 = __gnu_cxx::operator-(&local_108,&stack0xfffffffffffffee8);
    if (dVar9 % 8 == 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&pckt->mData,(value_type *)((long)&i._M_current + 3));
    }
  }
  sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pckt->mData);
  if (1 < sVar7) {
    pbVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&pckt->mData,1)
    ;
    pckt->mPID = (uint)*pbVar10;
  }
  sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pckt->mData);
  if (3 < sVar7) {
    pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back(&pckt->mData);
    vVar2 = *pvVar11;
    local_130._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&pckt->mData);
    local_128 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator-(&local_130,2);
    puVar12 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator*(&local_128);
    local_11a = CONCAT11(vVar2,*puVar12);
    sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pckt->mData);
    if (sVar7 == 4) {
      pckt->mCRC = (U16)((int)(uint)local_11a >> 0xb);
    }
    else {
      pckt->mCRC = local_11a;
    }
  }
  bVar4 = USBPacket::IsTokenPacket(pckt);
  if (bVar4) {
    sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pckt->mData);
    local_176 = true;
    if (sVar7 != 4) goto LAB_00163edf;
  }
  else {
LAB_00163edf:
    bVar4 = USBPacket::IsDataPacket(pckt);
    if (bVar4) {
      sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pckt->mData);
      local_176 = true;
      if (3 < sVar7) goto LAB_00163fcd;
    }
    bVar4 = USBPacket::IsHandshakePacket(pckt);
    if (bVar4) {
      sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pckt->mData);
      local_176 = true;
      if (sVar7 == 2) goto LAB_00163fcd;
    }
    if (pckt->mPID == PID_PRE) {
      sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pckt->mData);
      local_176 = true;
      if (sVar7 == 2) goto LAB_00163fcd;
    }
    bVar4 = USBPacket::IsSOFPacket(pckt);
    local_17a = false;
    if (bVar4) {
      sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pckt->mData);
      local_17a = sVar7 == 4;
    }
    local_176 = local_17a;
  }
LAB_00163fcd:
  this_local._7_1_ = local_176;
LAB_00163fe2:
  i._M_current._4_4_ = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  return this_local._7_1_;
}

Assistant:

bool USBSignalFilter::GetPacket( USBPacket& pckt, USBSignalState& sgnl )
{
    pckt.Clear();

    const U8 bits2add[] = { 0, 1, 1, 1, 1, 1, 1 };

    // a PRE packet switched us into low speed mode, so now we need to check
    // if this packet is low or full speed
    if( mExpectLowSpeed )
    {
        if( sgnl.IsData( FULL_SPEED ) && sgnl.GetNumBits( FULL_SPEED ) == 1 )
        {
            mSpeed = FULL_SPEED;
            mExpectLowSpeed = false; // switch back to full speed
        }
        else
        {
            mSpeed = LOW_SPEED;
        }
    }

    const double BIT_DUR = ( mSpeed == FULL_SPEED ? FS_BIT_DUR : LS_BIT_DUR );
    const double SAMPLE_DUR = 1e9 / mAnalyzer->GetSampleRate(); // 1 sample duration in ns
    const double BIT_SAMPLES = BIT_DUR / SAMPLE_DUR;

    std::vector<U8> bits;

    pckt.mSampleBegin = sgnl.mSampleBegin; // default for bad packets

    bool is_stuff_bit = false;
    bool is_pre_packet = false;
    while( sgnl.IsData( mSpeed ) && !is_pre_packet )
    {
        // get the number of bits in this signal
        int num_bits = sgnl.GetNumBits( mSpeed );

        const U8* add_begin = bits2add;
        const U8* add_end = bits2add + num_bits;

        // mind the stuffing bit
        if( is_stuff_bit )
            ++add_begin;

        // now add the data bits
        if( ( is_stuff_bit && num_bits > 1 ) || ( num_bits > 0 ) )
            bits.insert( bits.end(), add_begin, add_end );

        // do the bit markers and remember the samples at which a bit begins
        int bc;
        for( bc = 0; bc < num_bits; ++bc )
        {
            if( !is_stuff_bit || bc > 0 )
                pckt.mBitBeginSamples.push_back( sgnl.mSampleBegin + U64( BIT_SAMPLES * bc + .5 ) );

            mResults->AddMarker( sgnl.mSampleBegin + U64( BIT_SAMPLES * ( bc + .5 ) + .5 ),
                                 bc == 0 ? ( is_stuff_bit ? AnalyzerResults::ErrorX : AnalyzerResults::Zero ) : AnalyzerResults::One,
                                 mSettings->mDPChannel );
        }

        // check if this is a PRE token, in which case we switch to low-speed,
        // return and wait for the next packet
        if( mSpeed == FULL_SPEED && bits.size() == 16 ) // 8 bits for SYNC and 8 bits for PRE PID
        {
            const U8 preArr[ 16 ] = { 0, 0, 0, 0, 0, 0, 0, 1, 0, 0, 1, 1, 1, 1, 0, 0 }; // SYNC and PRE as they appear on the bus
            if( std::equal( bits.begin(), bits.end(), preArr ) )
            {
                mSpeed = LOW_SPEED;
                mExpectLowSpeed = true;
                is_pre_packet = true;
            }
        }

        // set the stuff bit flag for the next state
        is_stuff_bit = ( num_bits == 7 );

        // get the next signal state
        sgnl = GetState();
    }

    pckt.mSampleEnd = sgnl.mSampleEnd; // default for bad packets

    // add another element to mBitBeginSamples to mark the end of the last bit
    pckt.mBitBeginSamples.push_back( sgnl.mSampleBegin );

    // check the number of bits
    if( bits.empty() || ( bits.size() % 8 ) != 0 || ( pckt.mBitBeginSamples.size() % 8 ) != 1 )
    {
        return false;
    }

    // remember the begin & end samples for the entire packet
    pckt.mSampleBegin = pckt.mBitBeginSamples.front();
    pckt.mSampleEnd = sgnl.mSampleEnd + S64( BIT_DUR / SAMPLE_DUR + 0.5 );

    // make bytes out of these bits
    U8 val = 0;
    std::vector<U8>::iterator i( bits.begin() );
    while( i != bits.end() )
    {
        // least significant bit first
        val >>= 1;
        if( *i )
            val |= 0x80;

        ++i;

        // do we have a full byte?
        if( ( ( i - bits.begin() ) % 8 ) == 0 )
            pckt.mData.push_back( val );
    }

    // extract the PID
    if( pckt.mData.size() > 1 )
        pckt.mPID = USB_PID( pckt.mData[ 1 ] );

    // extract the CRC fields
    if( pckt.mData.size() >= 4 )
    {
        U16 last_word = ( pckt.mData.back() << 8 ) | *( pckt.mData.end() - 2 );

        if( pckt.mData.size() == 4 )
            pckt.mCRC = last_word >> 11;
        else
            pckt.mCRC = last_word;
    }

    return ( pckt.IsTokenPacket() && pckt.mData.size() == 4 ) || ( pckt.IsDataPacket() && pckt.mData.size() >= 4 ) ||
           ( pckt.IsHandshakePacket() && pckt.mData.size() == 2 ) || ( pckt.mPID == PID_PRE && pckt.mData.size() == 2 ) ||
           ( pckt.IsSOFPacket() && pckt.mData.size() == 4 );
}